

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

bool libwebm::vttdemux::ProcessBlockEntry(metadata_map_t *m,BlockEntry *block_entry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  longlong lVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  
  iVar2 = (*block_entry->_vptr_BlockEntry[2])(block_entry);
  lVar3 = mkvparser::Block::GetTrackNumber((Block *)CONCAT44(extraout_var,iVar2));
  p_Var4 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  bVar1 = true;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var5 = &(m->_M_t)._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var5->_M_header;
    do {
      if (lVar3 <= *(long *)(p_Var4 + 1)) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < lVar3];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var5) && (*(long *)(p_Var6 + 1) <= lVar3)) {
      iVar2 = (*block_entry->_vptr_BlockEntry[3])(block_entry);
      if (iVar2 == 2) {
        bVar1 = WriteCue((FILE *)p_Var6[1]._M_left,(BlockGroup *)block_entry);
        return bVar1;
      }
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool vttdemux::ProcessBlockEntry(const metadata_map_t& m,
                                 const mkvparser::BlockEntry* block_entry) {
  // If the track number for this block is in the cache, then we have
  // a metadata block, so write the WebVTT cue to the output file.

  const mkvparser::Block* const block = block_entry->GetBlock();
  const long long tn = block->GetTrackNumber();  // NOLINT

  typedef metadata_map_t::const_iterator iter_t;
  const iter_t i = m.find(static_cast<metadata_map_t::key_type>(tn));

  if (i == m.end())  // not a metadata track
    return true;  // nothing else to do

  if (block_entry->GetKind() != mkvparser::BlockEntry::kBlockGroup)
    return false;  // weird

  typedef mkvparser::BlockGroup BG;
  const BG* const block_group = static_cast<const BG*>(block_entry);

  const MetadataInfo& info = i->second;
  FILE* const f = info.file;

  return WriteCue(f, block_group);
}